

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

RegexMatcher * __thiscall icu_63::RegexMatcher::useTransparentBounds(RegexMatcher *this,UBool b)

{
  int64_t local_30;
  int64_t local_28;
  UBool b_local;
  RegexMatcher *this_local;
  
  this->fTransparentBounds = b;
  if (this->fTransparentBounds == '\0') {
    local_28 = this->fRegionStart;
  }
  else {
    local_28 = 0;
  }
  this->fLookStart = local_28;
  if (this->fTransparentBounds == '\0') {
    local_30 = this->fRegionLimit;
  }
  else {
    local_30 = this->fInputLength;
  }
  this->fLookLimit = local_30;
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::useTransparentBounds(UBool b) {
    fTransparentBounds = b;
    fLookStart = (fTransparentBounds ? 0 : fRegionStart);
    fLookLimit = (fTransparentBounds ? fInputLength : fRegionLimit);
    return *this;
}